

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  int iVar1;
  bool local_39;
  secp256k1_pubkey_conflict *pubkey;
  int ret;
  secp256k1_keypair *keypair_local;
  secp256k1_ge *pk_local;
  secp256k1_scalar *sk_local;
  secp256k1_context *ctx_local;
  
  secp256k1_declassify(ctx,keypair->data + 0x20,0x40);
  pubkey._4_4_ = secp256k1_pubkey_load(ctx,pk,(secp256k1_pubkey_conflict *)(keypair->data + 0x20));
  if (sk != (secp256k1_scalar *)0x0) {
    local_39 = false;
    if (pubkey._4_4_ != 0) {
      iVar1 = secp256k1_keypair_seckey_load(ctx,sk,keypair);
      local_39 = iVar1 != 0;
    }
    pubkey._4_4_ = (uint)local_39;
  }
  if ((pubkey._4_4_ == 0) && (memcpy(pk,&secp256k1_ge_const_g,0x58), sk != (secp256k1_scalar *)0x0))
  {
    sk->d[0] = 1;
    sk->d[1] = 0;
    sk->d[2] = 0;
    sk->d[3] = 0;
  }
  return pubkey._4_4_;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}